

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpop.c
# Opt level: O0

void * mpt_qpop(mpt_queue *queue,size_t len,void *data)

{
  void *__n;
  int *piVar1;
  void *local_40;
  uint8_t *base;
  size_t high;
  size_t low;
  void *data_local;
  size_t len_local;
  mpt_queue *queue_local;
  
  low = (size_t)data;
  data_local = (void *)len;
  len_local = (size_t)queue;
  local_40 = mpt_queue_data(queue,&high);
  __n = (void *)(*(long *)(len_local + 8) - high);
  if (__n == (void *)0x0) {
    if (high < data_local) {
      piVar1 = __errno_location();
      *piVar1 = 0x22;
      return (void *)0x0;
    }
    if (low != 0) {
      memcpy((void *)low,local_40,(size_t)data_local);
    }
  }
  else if (__n < data_local) {
    if (low == 0) {
      piVar1 = __errno_location();
      *piVar1 = 0x16;
      return (void *)0x0;
    }
    data_local = (void *)((long)data_local - (long)__n);
    if (high < data_local) {
      piVar1 = __errno_location();
      *piVar1 = 0x22;
      return (void *)0x0;
    }
    memcpy((void *)low,
           (void *)((*(long *)len_local + *(long *)(len_local + 0x10)) - (long)data_local),
           (size_t)__n);
    memcpy((void *)(low + (long)data_local),*(void **)len_local,(size_t)__n);
    local_40 = (void *)low;
  }
  else {
    local_40 = (void *)((long)__n + (*(long *)len_local - (long)data_local));
    if (low != 0) {
      memcpy((void *)low,local_40,(size_t)data_local);
    }
  }
  *(long *)(len_local + 8) = *(long *)(len_local + 8) - (long)data_local;
  return local_40;
}

Assistant:

extern void *mpt_qpop(MPT_STRUCT(queue) *queue, size_t len, void *data)
{
	size_t low, high;
	uint8_t *base;
	
	/* get data contentent/offset at queue end */
	base = mpt_queue_data(queue, &low);
	high = queue->len - low;
	
	/* aligned queue */
	if (!high) {
		if (len > low) {
			errno = ERANGE;
			return 0;
		}
		if (data) {
			memcpy(data, base, len);
		}
	}
	/* data in sparate parts */
	else if (len > high) {
		if (!data) {
			errno = EINVAL;
			return 0;
		}
		len -= high;
		if (len > low) {
			errno = ERANGE;
			return 0;
		}
		base = ((uint8_t *) queue->base) + queue->max - len;
		memcpy(data, base, high);
		memcpy(((uint8_t *) data) + len, queue->base, high);
		
		base = data;
	}
	/* data in high part */
	else {
		high -= len;
		base = ((uint8_t *) queue->base) + high;
		if (data) {
			memcpy(data, base, len);
		}
	}
	queue->len -= len;
	
	return base;
}